

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.h
# Opt level: O2

void __thiscall bsplib::Rdma::ActionBuf::push_back(ActionBuf *this,Action *action)

{
  pointer puVar1;
  
  std::vector<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>::push_back
            (&this->m_actions,action);
  puVar1 = (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + action->target_pid;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void push_back( const Action & action )
        {   
            m_actions.push_back( action );
            m_counts[ action.target_pid ] += 1;
        }